

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptStackWalker::Walk(JavascriptStackWalker *this,bool includeInlineFrames)

{
  byte bVar1;
  ScriptEntryExitRecord *pSVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  undefined4 *puVar6;
  JavascriptFunction *function;
  
  this->interpreterFrame = (InterpreterStackFrame *)0x0;
  uVar5 = *(ushort *)&this->field_0x50;
  if ((char)uVar5 < '\0' && (this->lastInternalFrameInfo).codeAddress != (void *)0x0) {
    uVar5 = uVar5 & 0xff7f;
    *(ushort *)&this->field_0x50 = uVar5;
    (this->lastInternalFrameInfo).codeAddress = (void *)0x0;
    (this->lastInternalFrameInfo).framePointer = (void *)0x0;
    (this->lastInternalFrameInfo).stackCheckCodeHeight = 0xffffffff;
    (this->lastInternalFrameInfo).frameType = InternalFrameType_None;
    (this->lastInternalFrameInfo).function = (JavascriptFunction *)0x0;
    (this->lastInternalFrameInfo).hasInlinedFramesOnStack = false;
    (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout = false;
  }
  if ((uVar5 & 1) != 0) {
    if (!includeInlineFrames) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x2d4,"(includeInlineFrames)","includeInlineFrames");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    bVar4 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
    *(ushort *)&this->field_0x50 = (ushort)*(undefined4 *)&this->field_0x50 & 0xfffe | (ushort)bVar4
    ;
    if (!bVar4) {
      InlinedFrameWalker::Close(&this->inlinedFrameWalker);
      bVar4 = IsCurrentPhysicalFrameForLoopBody(this);
      if (bVar4) {
        function = GetCurrentFunctionFromPhysicalFrame(this);
        SetCachedInternalFrameInfo
                  (this,InternalFrameType_LoopBody,function,true,
                   SUB41((*(ushort *)&this->field_0x50 & 0x40) >> 6,0));
        this->field_0x50 = this->field_0x50 & 0xfb;
        return 1;
      }
      return 1;
    }
    return 1;
  }
  *(ushort *)&this->field_0x50 = uVar5 & 0xfffd;
  if ((uVar5 & 0x10) == 0) {
    bVar4 = Amd64StackFrame::Next(&this->currentFrame);
    if (!bVar4) {
      this->field_0x50 = this->field_0x50 & 0xfb;
      return 0;
    }
  }
  else {
    *(ushort *)&this->field_0x50 = uVar5 & 0xffed;
  }
  pSVar2 = this->entryExitRecord;
  if ((this->currentFrame).addressOfCodeAddr != pSVar2->addrOfReturnAddrOfScriptEntryFunction) {
LAB_009d1d0f:
    UpdateFrame(this,includeInlineFrames);
    return 1;
  }
  bVar1 = *(byte *)pSVar2;
  pSVar2 = pSVar2->next;
  this->entryExitRecord = pSVar2;
  if (pSVar2 == (ScriptEntryExitRecord *)0x0) {
    uVar5 = 0xfffb;
  }
  else {
    if ((((bVar1 | (byte)(*(ushort *)&this->field_0x50 >> 8)) & 1) != 0) ||
       (this->scriptContext->isDiagnosticsScriptContext != false)) {
      this->scriptContext = pSVar2->scriptContext;
      Amd64StackFrame::SkipToFrame(&this->currentFrame,pSVar2->frameIdOfScriptExitFunction);
      goto LAB_009d1d0f;
    }
    uVar5 = 0xfefb;
  }
  *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & uVar5;
  return 0;
}

Assistant:

BOOL JavascriptStackWalker::Walk(bool includeInlineFrames)
    {
        // Walk one frame up the call stack.
        this->interpreterFrame = NULL;

#if ENABLE_NATIVE_CODEGEN
        if (lastInternalFrameInfo.codeAddress != nullptr && this->previousInterpreterFrameIsForLoopBody)
        {
            this->previousInterpreterFrameIsForLoopBody = false;
            ClearCachedInternalFrameInfo();
        }

        if (inlinedFramesBeingWalked)
        {
            Assert(includeInlineFrames);
            inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
            if (!inlinedFramesBeingWalked)
            {
                inlinedFrameWalker.Close();
                if ((this->IsCurrentPhysicalFrameForLoopBody()))
                {
                    // Done walking inlined frames in a loop body, cache the native code address now
                    // in order to skip the loop body frame.
                    this->SetCachedInternalFrameInfo(InternalFrameType_LoopBody, this->GetCurrentFunctionFromPhysicalFrame(), true /*hasInlinedFramesOnStack*/, previousInterpreterFrameIsFromBailout);
                    isJavascriptFrame = false;
                }
            }

            return true;
        }
#endif
        this->hasInlinedFramesOnStack = false;
        if (this->isInitialFrame)
        {
            this->isInitialFrame = false; // Only walk initial frame once
        }
        else if (!this->currentFrame.Next())
        {
            this->isJavascriptFrame = false;
            return false;
        }

        // If we're at the entry from a host frame, hop to the frame from which we left the script.
        if (AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfInstructionPointer(), this->entryExitRecord->addrOfReturnAddrOfScriptEntryFunction))
        {
            BOOL hasCaller = this->entryExitRecord->hasCaller || this->forceFullWalk;

#ifdef CHECK_STACKWALK_EXCEPTION
            BOOL ignoreStackWalkException = this->entryExitRecord->ignoreStackWalkException;
#endif

            this->entryExitRecord = this->entryExitRecord->next;
            if (this->entryExitRecord == NULL)
            {
                this->isJavascriptFrame = false;
                return false;
            }

            if (!hasCaller && !this->scriptContext->IsDiagnosticsScriptContext())
            {
#ifdef CHECK_STACKWALK_EXCEPTION
                if (!ignoreStackWalkException)
                {
                    AssertMsg(false, "walk pass no caller frame");
                }
#endif
                this->isJavascriptFrame = false;
                return false;
            }

            this->scriptContext = this->entryExitRecord->scriptContext;
            this->currentFrame.SkipToFrame(this->entryExitRecord->frameIdOfScriptExitFunction);
        }

        this->UpdateFrame(includeInlineFrames);
        return true;
    }